

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_read_bytes(coda_cursor *cursor,uint8_t *dst,int64_t offset,int64_t length)

{
  int iVar1;
  undefined1 local_348 [8];
  coda_cursor sub_cursor;
  coda_mem_type *type;
  int64_t length_local;
  int64_t offset_local;
  uint8_t *dst_local;
  coda_cursor *cursor_local;
  
  sub_cursor.stack[0x1f].bit_offset = (int64_t)cursor->stack[cursor->n + -1].type;
  if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend == 3) {
    memcpy(local_348,cursor,0x310);
    iVar1 = coda_cursor_use_base_type_of_special_type((coda_cursor *)local_348);
    if (iVar1 == 0) {
      cursor_local._4_4_ = coda_cursor_read_bytes((coda_cursor *)local_348,dst,offset,length);
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  else if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend == 2) {
    if ((((coda_dynamic_type_struct *)sub_cursor.stack[0x1f].bit_offset)->definition->format ==
         coda_format_ascii) ||
       (((coda_dynamic_type_struct *)sub_cursor.stack[0x1f].bit_offset)->definition->format ==
        coda_format_xml)) {
      cursor_local._4_4_ = coda_ascii_cursor_read_bytes(cursor,dst,offset,length);
    }
    else {
      cursor_local._4_4_ = coda_bin_cursor_read_bytes(cursor,dst,offset,length);
    }
  }
  else {
    coda_set_error(-0x69,"can not read this data using a raw bytes data type");
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_read_bytes(const coda_cursor *cursor, uint8_t *dst, int64_t offset, int64_t length)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_read_bytes(&sub_cursor, dst, offset, length);
    }

    if (type->tag == tag_mem_data)
    {
        if (type->definition->format == coda_format_ascii || type->definition->format == coda_format_xml)
        {
            return coda_ascii_cursor_read_bytes(cursor, dst, offset, length);
        }
        return coda_bin_cursor_read_bytes(cursor, dst, offset, length);
    }

    coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read this data using a raw bytes data type");
    return -1;
}